

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

SQInteger __thiscall
SQString::Next(SQString *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  char cVar2;
  undefined1 *puVar3;
  SQTable *pSVar4;
  
  if ((refpos->super_SQObject)._type == OT_INTEGER) {
    pSVar4 = (refpos->super_SQObject)._unVal.pTable;
  }
  else {
    pSVar4 = (SQTable *)0x0;
  }
  puVar3 = (undefined1 *)0xffffffffffffffff;
  if ((long)pSVar4 < this->_len) {
    if (((outkey->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (outkey->super_SQObject)._type = OT_INTEGER;
    (outkey->super_SQObject)._unVal.pTable = pSVar4;
    cVar2 = this->_val[(long)pSVar4];
    if (((outval->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (outval->super_SQObject)._type = OT_INTEGER;
    (outval->super_SQObject)._unVal = (SQObjectValue)(long)cVar2;
    puVar3 = (undefined1 *)
             ((long)&(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                     _vptr_SQRefCounted + 1);
  }
  return (SQInteger)puVar3;
}

Assistant:

SQInteger SQString::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while(idx < _len){
        outkey = (SQInteger)idx;
        outval = (SQInteger)((SQUnsignedInteger)_val[idx]);
        //return idx for the next iteration
        return ++idx;
    }
    //nothing to iterate anymore
    return -1;
}